

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O1

ChunkVectorInfo * __thiscall
duckdb::RowVersionManager::GetVectorInfo(RowVersionManager *this,idx_t vector_idx)

{
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *this_00;
  idx_t iVar1;
  transaction_t tVar2;
  ChunkInfo *in_RAX;
  reference pvVar3;
  pointer pCVar4;
  ChunkConstantInfo *pCVar5;
  ChunkVectorInfo *pCVar6;
  pointer pCVar7;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var8;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var9;
  idx_t i;
  long lVar10;
  templated_unique_single_t new_info;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  FillVectorInfo(this,vector_idx);
  this_00 = &this->vector_info;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::operator[](this_00,vector_idx);
  if ((pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
      super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl == (ChunkInfo *)0x0) {
    iVar1 = this->start;
    _Var8._M_head_impl = (ChunkInfo *)operator_new(0x8030);
    ChunkVectorInfo::ChunkVectorInfo
              ((ChunkVectorInfo *)_Var8._M_head_impl,vector_idx * 0x800 + iVar1);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::operator[](this_00,vector_idx);
    _Var9._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t
         .super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
         super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
    super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = _Var8._M_head_impl;
  }
  else {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::operator[](this_00,vector_idx);
    pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                       (pvVar3);
    if (pCVar4->type != CONSTANT_INFO) goto LAB_0110c9a8;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::operator[](this_00,vector_idx);
    pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                       (pvVar3);
    pCVar5 = ChunkInfo::Cast<duckdb::ChunkConstantInfo>(pCVar4);
    iVar1 = this->start;
    pCVar6 = (ChunkVectorInfo *)operator_new(0x8030);
    ChunkVectorInfo::ChunkVectorInfo(pCVar6,vector_idx * 0x800 + iVar1);
    tVar2 = pCVar5->insert_id;
    local_38._M_head_impl = (ChunkInfo *)pCVar6;
    pCVar7 = unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
             ::operator->((unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
                           *)&local_38);
    pCVar7->insert_id = tVar2;
    lVar10 = 0;
    do {
      tVar2 = pCVar5->insert_id;
      pCVar7 = unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
               ::operator->((unique_ptr<duckdb::ChunkVectorInfo,_std::default_delete<duckdb::ChunkVectorInfo>,_true>
                             *)&local_38);
      _Var9._M_head_impl = local_38._M_head_impl;
      pCVar7->inserted[lVar10] = tVar2;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x800);
    local_38._M_head_impl = (ChunkInfo *)0x0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
             ::operator[](this_00,vector_idx);
    _Var8._M_head_impl =
         (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t
         .super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
         super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
    (pvVar3->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
    super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = _Var9._M_head_impl;
    _Var9._M_head_impl = local_38._M_head_impl;
    if (_Var8._M_head_impl != (ChunkInfo *)0x0) {
      (**(code **)((long)(_Var8._M_head_impl)->_vptr_ChunkInfo + 8))();
      _Var9._M_head_impl = local_38._M_head_impl;
    }
  }
  if (_Var9._M_head_impl != (ChunkInfo *)0x0) {
    (*(_Var9._M_head_impl)->_vptr_ChunkInfo[1])();
  }
LAB_0110c9a8:
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::operator[](this_00,vector_idx);
  pCVar4 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator->
                     (pvVar3);
  pCVar6 = ChunkInfo::Cast<duckdb::ChunkVectorInfo>(pCVar4);
  return pCVar6;
}

Assistant:

ChunkVectorInfo &RowVersionManager::GetVectorInfo(idx_t vector_idx) {
	FillVectorInfo(vector_idx);

	if (!vector_info[vector_idx]) {
		// no info yet: create it
		vector_info[vector_idx] = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
	} else if (vector_info[vector_idx]->type == ChunkInfoType::CONSTANT_INFO) {
		auto &constant = vector_info[vector_idx]->Cast<ChunkConstantInfo>();
		// info exists but it's a constant info: convert to a vector info
		auto new_info = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
		new_info->insert_id = constant.insert_id;
		for (idx_t i = 0; i < STANDARD_VECTOR_SIZE; i++) {
			new_info->inserted[i] = constant.insert_id;
		}
		vector_info[vector_idx] = std::move(new_info);
	}
	D_ASSERT(vector_info[vector_idx]->type == ChunkInfoType::VECTOR_INFO);
	return vector_info[vector_idx]->Cast<ChunkVectorInfo>();
}